

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diag.cpp
# Opt level: O2

int __thiscall ncnn::Diag::forward(Diag *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  if (bottom_blob->dims == 2) {
    uVar1 = bottom_blob->w;
    uVar7 = bottom_blob->h;
    uVar10 = uVar1 - uVar7;
    uVar13 = (int)uVar10 >> 0x1f & uVar10;
    uVar11 = 0;
    if (0 < (int)uVar10) {
      uVar11 = uVar10;
    }
    iVar3 = this->diagonal;
    if (iVar3 < (int)uVar13 || (int)uVar11 < iVar3) {
      if ((iVar3 == -uVar7 || SBORROW4(iVar3,-uVar7) != (int)(iVar3 + uVar7) < 0) ||
          (int)uVar13 <= iVar3) {
        uVar10 = 0;
        if ((int)uVar11 < iVar3) {
          uVar10 = uVar1 - iVar3;
          if (uVar1 - iVar3 == 0 || (int)uVar1 < iVar3) {
            uVar10 = 0;
          }
        }
      }
      else {
        uVar10 = iVar3 + uVar7;
      }
    }
    else {
      uVar10 = uVar1;
      if ((int)uVar7 < (int)uVar1) {
        uVar10 = uVar7;
      }
    }
    Mat::create(top_blob,uVar10,bottom_blob->elemsize,opt->blob_allocator);
    pvVar5 = top_blob->data;
    if ((pvVar5 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
      iVar3 = -100;
      if (uVar10 == 0) {
        iVar3 = 0;
      }
    }
    else {
      uVar1 = this->diagonal;
      iVar3 = 0;
      uVar12 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar12 = 0;
      }
      uVar4 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar4 = 0;
      }
      iVar6 = bottom_blob->w;
      pvVar9 = (void *)(uVar12 * 4 + (long)bottom_blob->data);
      sVar2 = bottom_blob->elemsize;
      iVar8 = -((int)uVar1 >> 0x1f & uVar1);
      for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
        *(undefined4 *)((long)pvVar5 + uVar12 * 4) =
             *(undefined4 *)((long)pvVar9 + (long)iVar6 * sVar2 * (long)iVar8);
        pvVar9 = (void *)((long)pvVar9 + 4);
        iVar8 = iVar8 + 1;
      }
    }
  }
  else {
    iVar3 = 0;
    if (bottom_blob->dims == 1) {
      uVar1 = bottom_blob->w;
      iVar3 = this->diagonal;
      iVar6 = -iVar3;
      if (0 < iVar3) {
        iVar6 = iVar3;
      }
      Mat::create(top_blob,iVar6 + uVar1,iVar6 + uVar1,bottom_blob->elemsize,opt->blob_allocator);
      pvVar5 = top_blob->data;
      iVar3 = -100;
      if (pvVar5 != (void *)0x0) {
        if (top_blob->cstep * (long)top_blob->c != 0) {
          uVar7 = (int)top_blob->cstep * top_blob->c;
          uVar4 = 0;
          uVar12 = (ulong)uVar7;
          if ((int)uVar7 < 1) {
            uVar12 = uVar4;
          }
          for (; (int)uVar12 != (int)uVar4; uVar4 = uVar4 + 1) {
            *(undefined4 *)((long)pvVar5 + uVar4 * 4) = 0;
          }
          uVar7 = this->diagonal;
          iVar3 = 0;
          uVar12 = (ulong)uVar7;
          if ((int)uVar7 < 1) {
            uVar12 = 0;
          }
          pvVar9 = bottom_blob->data;
          iVar6 = top_blob->w;
          uVar4 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar4 = 0;
          }
          pvVar5 = (void *)((long)pvVar5 + uVar12 * 4);
          sVar2 = top_blob->elemsize;
          iVar8 = -((int)uVar7 >> 0x1f & uVar7);
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            *(undefined4 *)((long)pvVar5 + (long)iVar6 * sVar2 * (long)iVar8) =
                 *(undefined4 *)((long)pvVar9 + uVar12 * 4);
            pvVar5 = (void *)((long)pvVar5 + 4);
            iVar8 = iVar8 + 1;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int Diag::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 1)
    {
        int w = bottom_blob.w;
        int top_w = w + ((diagonal >= 0) ? diagonal : -diagonal);

        top_blob.create(top_w, top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.fill(0.0f);

        int bias_r = -std::min(diagonal, 0);
        int bias_c = std::max(diagonal, 0);

        for (int i = 0; i < w; i++)
        {
            top_blob.row(i + bias_r)[i + bias_c] = bottom_blob[i];
        }
    }
    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int len = 0;
        int minimum = std::min(w - h, 0);
        int maximum = std::max(w - h, 0);
        if (diagonal <= maximum && diagonal >= minimum)
            len = std::min(w, h);
        else if (diagonal > -h && diagonal < minimum)
            len = diagonal + h;
        else if (diagonal > maximum && diagonal < w)
            len = -diagonal + w;

        top_blob.create(len, elemsize, opt.blob_allocator);
        if (top_blob.empty())
        {
            if (len == 0)
                return 0;
            return -100;
        }

        int bias_r = -std::min(diagonal, 0);
        int bias_c = std::max(diagonal, 0);

        for (int i = 0; i < len; i++)
        {
            top_blob[i] = bottom_blob.row(i + bias_r)[i + bias_c];
        }
    }

    return 0;
}